

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O2

void Pla_ManConvertToBits(Pla_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *p_00;
  word *pwVar2;
  word Fill;
  int i;
  int i_00;
  
  Vec_IntFillNatural(&p->vCubes,(p->vCubeLits).nSize);
  Vec_WrdFill(&p->vInBits,p->nInWords * (p->vCubes).nSize,Fill);
  i = 0;
  do {
    if ((p->vCubeLits).nSize <= i) {
      return;
    }
    p_00 = Vec_WecEntry(&p->vCubeLits,i);
    for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
      uVar1 = Vec_IntEntry(p_00,i_00);
      pwVar2 = Pla_CubeIn(p,i);
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      pwVar2[uVar1 >> 6] = pwVar2[uVar1 >> 6] | 2 - (ulong)(uVar1 & 1) << ((byte)uVar1 & 0x3e);
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Pla_ManConvertToBits( Pla_Man_t * p )
{
    Vec_Int_t * vCube; int i, k, Lit;
    Vec_IntFillNatural( &p->vCubes, Vec_WecSize(&p->vCubeLits) );
    Vec_WrdFill( &p->vInBits,  Pla_ManCubeNum(p) * p->nInWords,  0 );
    Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
        Vec_IntForEachEntry( vCube, Lit, k )
            Pla_CubeSetLit( Pla_CubeIn(p, i), Abc_Lit2Var(Lit), Abc_LitIsCompl(Lit) ? PLA_LIT_ZERO : PLA_LIT_ONE );
}